

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O1

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapeTriang> *this,TPZCompMesh *mesh,
          TPZCompElHDiv<pzshape::TPZShapeTriang> *copy)

{
  ulong uVar1;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_01924750;
  TPZIntelGen<pzshape::TPZShapeTriang>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeTriang>,&PTR_PTR_019216a0,mesh,
             &copy->super_TPZIntelGen<pzshape::TPZShapeTriang>);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHDiv_019212c8;
  (this->fSideOrient).super_TPZVec<int>.fStore = (int *)0x0;
  (this->fSideOrient).super_TPZVec<int>.fNElements = 0;
  (this->fSideOrient).super_TPZVec<int>.fNAlloc = 0;
  (this->fSideOrient).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018437d0;
  uVar1 = (copy->fSideOrient).super_TPZVec<int>.fNElements;
  if ((long)uVar1 < 4) {
    piVar3 = (this->fSideOrient).fExtAlloc;
    uVar4 = 0;
  }
  else {
    piVar3 = (int *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    uVar4 = uVar1;
  }
  (this->fSideOrient).super_TPZVec<int>.fStore = piVar3;
  (this->fSideOrient).super_TPZVec<int>.fNElements = uVar1;
  (this->fSideOrient).super_TPZVec<int>.fNAlloc = uVar4;
  if (0 < (long)uVar1) {
    piVar3 = (copy->fSideOrient).super_TPZVec<int>.fStore;
    piVar2 = (this->fSideOrient).super_TPZVec<int>.fStore;
    uVar4 = 0;
    do {
      piVar2[uVar4] = piVar3[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->fRestraints;
  (this->fRestraints).super__List_base<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>.
  _M_impl._M_node._M_size = 0;
  TPZVec<long>::TPZVec(&(this->fConnectIndexes).super_TPZVec<long>,0);
  (this->fConnectIndexes).super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_018a0548;
  (this->fConnectIndexes).super_TPZVec<long>.fStore = (this->fConnectIndexes).fExtAlloc;
  (this->fConnectIndexes).super_TPZVec<long>.fNElements = 4;
  (this->fConnectIndexes).super_TPZVec<long>.fNAlloc = 0;
  *(undefined4 *)(this->fConnectIndexes).fExtAlloc = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 4) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 1) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0xc) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 2) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x14) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 3) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x1c) = 0xffffffff;
  this->fhdivfam = copy->fhdivfam;
  (this->super_TPZIntelGen<pzshape::TPZShapeTriang>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder =
       (copy->super_TPZIntelGen<pzshape::TPZShapeTriang>).super_TPZInterpolatedElement.
       super_TPZInterpolationSpace.fPreferredOrder;
  TPZManVector<long,_4>::operator=(&this->fConnectIndexes,&copy->fConnectIndexes);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv(TPZCompMesh &mesh, const TPZCompElHDiv<TSHAPE> &copy) :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>(mesh,copy), fSideOrient(copy.fSideOrient), fhdivfam(copy.fhdivfam)
{
	this-> fPreferredOrder = copy.fPreferredOrder;
    this->fConnectIndexes = copy.fConnectIndexes;
}